

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseHTML(TidyDocImpl *doc,Node *html,GetTokenMode mode)

{
  TidyParserMemory data;
  TidyParserMemory data_00;
  TidyParserMemory data_01;
  TidyParserMemory data_02;
  Bool BVar1;
  code *pcStack_140;
  TidyParserMemory memory_4;
  TidyParserMemory memory_3;
  TidyParserMemory memory_2;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Node *pNStack_48;
  parserState state;
  Node *noframes;
  Node *frameset;
  Node *head;
  Node *node;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *html_local;
  TidyDocImpl *doc_local;
  
  head = (Node *)0x0;
  noframes = (Node *)0x0;
  pNStack_48 = (Node *)0x0;
  memory._44_4_ = 0;
  prvTidySetOptionBool(doc,TidyXmlTags,no);
  pNStack_20 = html;
  node._4_4_ = mode;
  if (html == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    head = memory.original_node;
    pNStack_20 = (Node *)memory.identity;
    memory._44_4_ = memory.reentry_node._4_4_;
    node._4_4_ = (GetTokenMode)memory.reentry_node;
  }
  do {
    if (memory._44_4_ == 1) {
      return (Node *)0x0;
    }
    if ((memory._44_4_ == 0) || (memory._44_4_ == 2)) {
      head = prvTidyGetToken(doc,IgnoreWhitespace);
    }
    switch(memory._44_4_) {
    case (BADTYPE)0x0:
      if (head == (Node *)0x0) {
        head = prvTidyInferredTag(doc,TidyTag_HEAD);
        memory._44_4_ = 4;
      }
      else if (((head == (Node *)0x0) || (head->tag == (Dict *)0x0)) ||
              (head->tag->id != TidyTag_HEAD)) {
        if (((pNStack_20 == (Node *)0x0) || (head->tag != pNStack_20->tag)) ||
           (head->type != EndTag)) {
          if (((pNStack_20 == (Node *)0x0) || (head->tag != pNStack_20->tag)) ||
             (head->type != StartTag)) {
            BVar1 = InsertMisc(pNStack_20,head);
            if (BVar1 == no) {
              prvTidyUngetToken(doc);
              head = prvTidyInferredTag(doc,TidyTag_HEAD);
              memory._44_4_ = 4;
            }
          }
          else {
            prvTidyReport(doc,pNStack_20,head,0x235);
            prvTidyFreeNode(doc,head);
          }
        }
        else {
          prvTidyReport(doc,pNStack_20,head,0x235);
          prvTidyFreeNode(doc,head);
        }
      }
      else {
        memory._44_4_ = 4;
      }
      break;
    default:
      memory._44_4_ = 1;
      break;
    case (BADTYPE)0x2:
      if (head == (Node *)0x0) {
        if (noframes == (Node *)0x0) {
          head = prvTidyInferredTag(doc,TidyTag_BODY);
          memory._44_4_ = 3;
        }
        else {
          memory._44_4_ = 1;
        }
      }
      else if (head->tag == pNStack_20->tag) {
        if ((head->type != StartTag) && (noframes == (Node *)0x0)) {
          prvTidyReport(doc,pNStack_20,head,0x235);
        }
        prvTidyFreeNode(doc,head);
      }
      else {
        BVar1 = InsertMisc(pNStack_20,head);
        if (BVar1 == no) {
          if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) &&
             (head->tag->id == TidyTag_BODY)) {
            if (head->type == StartTag) {
              if (((doc->config).value[1].v == 0) && (noframes != (Node *)0x0)) {
                prvTidyUngetToken(doc);
                if (pNStack_48 == (Node *)0x0) {
                  pNStack_48 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
                  prvTidyInsertNodeAtEnd(noframes,pNStack_48);
                  prvTidyReport(doc,pNStack_20,pNStack_48,0x247);
                }
                else if (pNStack_48->type == StartEndTag) {
                  pNStack_48->type = StartTag;
                }
                memory._44_4_ = 6;
              }
              else {
                prvTidyConstrainVersion(doc,0xfffffb6f);
                memory._44_4_ = 3;
              }
            }
            else {
              prvTidyReport(doc,pNStack_20,head,0x235);
              prvTidyFreeNode(doc,head);
            }
            break;
          }
          if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) &&
             (head->tag->id == TidyTag_FRAMESET)) {
            if (head->type == StartTag) {
              if (noframes == (Node *)0x0) {
                noframes = head;
              }
              else {
                prvTidyReport(doc,pNStack_20,head,0x237);
              }
              memory._44_4_ = 8;
            }
            else {
              prvTidyReport(doc,pNStack_20,head,0x235);
              prvTidyFreeNode(doc,head);
            }
            break;
          }
          if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) &&
             (head->tag->id == TidyTag_NOFRAMES)) {
            if (head->type == StartTag) {
              if (noframes == (Node *)0x0) {
                prvTidyReport(doc,pNStack_20,head,0x235);
                prvTidyFreeNode(doc,head);
                head = prvTidyInferredTag(doc,TidyTag_BODY);
                memory._44_4_ = 3;
              }
              else if (pNStack_48 == (Node *)0x0) {
                pNStack_48 = head;
                prvTidyInsertNodeAtEnd(noframes,head);
                memory._44_4_ = 6;
              }
              else {
                prvTidyFreeNode(doc,head);
              }
            }
            else {
              prvTidyReport(doc,pNStack_20,head,0x235);
              prvTidyFreeNode(doc,head);
            }
            break;
          }
          BVar1 = prvTidynodeIsElement(head);
          if (BVar1 != no) {
            if ((head->tag != (Dict *)0x0) && ((head->tag->model & 4) != 0)) {
              MoveToHead(doc,pNStack_20,head);
              break;
            }
            if ((((noframes != (Node *)0x0) && (head != (Node *)0x0)) && (head->tag != (Dict *)0x0))
               && (head->tag->id == TidyTag_FRAME)) {
              prvTidyReport(doc,pNStack_20,head,0x235);
              prvTidyFreeNode(doc,head);
              break;
            }
          }
          prvTidyUngetToken(doc);
          if (noframes == (Node *)0x0) {
            head = prvTidyInferredTag(doc,TidyTag_BODY);
            if ((int)(doc->config).value[6].v != 1) {
              prvTidyReport(doc,pNStack_20,head,0x247);
            }
            prvTidyConstrainVersion(doc,0xfffffb6f);
            memory._44_4_ = 3;
          }
          else {
            if (pNStack_48 == (Node *)0x0) {
              pNStack_48 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
              prvTidyInsertNodeAtEnd(noframes,pNStack_48);
            }
            else {
              prvTidyReport(doc,pNStack_20,head,0x267);
              if (pNStack_48->type == StartEndTag) {
                pNStack_48->type = StartTag;
              }
            }
            prvTidyConstrainVersion(doc,0x490);
            memory._44_4_ = 6;
          }
          break;
        }
      }
      break;
    case (BADTYPE)0x3:
      memset(&memory_3.register_2,0,0x30);
      memory_3.register_2 = 0;
      memory_3._44_4_ = 0;
      memory_2.reentry_mode = node._4_4_;
      memory_2.identity = (Parser *)pNStack_20;
      memory_2.original_node = (Node *)0x0;
      memory_2.reentry_node._0_4_ = node._4_4_;
      memory_2.reentry_node._4_4_ = 1;
      prvTidyInsertNodeAtEnd(pNStack_20,head);
      data_00.reentry_state = memory_2.reentry_node._4_4_;
      data_00.reentry_mode = (GetTokenMode)memory_2.reentry_node;
      data_00.register_1 = memory_2.reentry_state;
      data_00.mode = memory_2.reentry_mode;
      data_00.original_node = (Node *)memory_2.identity;
      data_00.identity = (Parser *)memory_3._40_8_;
      data_00.reentry_node = memory_2.original_node;
      data_00.register_2 = memory_2.mode;
      data_00._44_4_ = memory_2.register_1;
      prvTidypushMemory(doc,data_00);
      return head;
    case (BADTYPE)0x4:
      memset(&memory_2.register_2,0,0x30);
      memory_2._40_8_ = prvTidyParseHTML;
      memory_1.reentry_mode = node._4_4_;
      memory_1.identity = (Parser *)pNStack_20;
      memory_1.original_node = head;
      memory_1.reentry_node._0_4_ = node._4_4_;
      memory_1.reentry_node._4_4_ = 5;
      prvTidyInsertNodeAtEnd(pNStack_20,head);
      data.reentry_state = memory_1.reentry_node._4_4_;
      data.reentry_mode = (GetTokenMode)memory_1.reentry_node;
      data.register_1 = memory_1.reentry_state;
      data.mode = memory_1.reentry_mode;
      data.original_node = (Node *)memory_1.identity;
      data.identity = (Parser *)memory_2._40_8_;
      data.reentry_node = memory_1.original_node;
      data.register_2 = memory_1.mode;
      data._44_4_ = memory_1.register_1;
      prvTidypushMemory(doc,data);
      return head;
    case (BADTYPE)0x5:
      memory._44_4_ = 2;
      break;
    case (BADTYPE)0x6:
      memset(&memory_4.register_2,0,0x30);
      memory_4._40_8_ = prvTidyParseHTML;
      memory_3.reentry_mode = node._4_4_;
      memory_3.identity = (Parser *)pNStack_20;
      memory_3.original_node = noframes;
      memory_3.reentry_node._0_4_ = node._4_4_;
      memory_3.reentry_node._4_4_ = 7;
      data_01.reentry_state = 7;
      data_01.reentry_mode = node._4_4_;
      data_01.register_1 = memory_3.reentry_state;
      data_01.mode = node._4_4_;
      data_01.original_node = pNStack_20;
      data_01.identity = prvTidyParseHTML;
      data_01.reentry_node = noframes;
      data_01.register_2 = memory_3.mode;
      data_01._44_4_ = memory_3.register_1;
      prvTidypushMemory(doc,data_01);
      return pNStack_48;
    case (BADTYPE)0x7:
      noframes = head;
      memory._44_4_ = 2;
      break;
    case (BADTYPE)0x8:
      memset(&pcStack_140,0,0x30);
      pcStack_140 = prvTidyParseHTML;
      memory_4.reentry_mode = node._4_4_;
      memory_4.identity = (Parser *)pNStack_20;
      memory_4.original_node = noframes;
      memory_4.reentry_node._0_4_ = node._4_4_;
      memory_4.reentry_node._4_4_ = 9;
      prvTidyInsertNodeAtEnd(pNStack_20,head);
      data_02.reentry_state = memory_4.reentry_node._4_4_;
      data_02.reentry_mode = (GetTokenMode)memory_4.reentry_node;
      data_02.register_1 = memory_4.reentry_state;
      data_02.mode = memory_4.reentry_mode;
      data_02.original_node = (Node *)memory_4.identity;
      data_02.identity = pcStack_140;
      data_02.reentry_node = memory_4.original_node;
      data_02.register_2 = memory_4.mode;
      data_02._44_4_ = memory_4.register_1;
      prvTidypushMemory(doc,data_02);
      return head;
    case (BADTYPE)0x9:
      noframes = head;
      for (head = head->content; head != (Node *)0x0; head = head->next) {
        if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) &&
           (head->tag->id == TidyTag_NOFRAMES)) {
          pNStack_48 = head;
        }
      }
      memory._44_4_ = 2;
    }
  } while( true );
}

Assistant:

Node* TY_(ParseHTML)( TidyDocImpl *doc, Node *html, GetTokenMode mode )
{
    Node *node = NULL;
    Node *head = NULL;
    Node *frameset = NULL;
    Node *noframes = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_COMPLETE,               /* Complete! */
        STATE_PRE_BODY,               /* In this state, we'll consider frames vs. body. */
        STATE_PARSE_BODY,             /* In this state, we can parse the body. */
        STATE_PARSE_HEAD,             /* In this state, we will setup head for parsing. */
        STATE_PARSE_HEAD_REENTER,     /* Resume here after parsing head. */
        STATE_PARSE_NOFRAMES,         /* In this state, we can parse noframes content. */
        STATE_PARSE_NOFRAMES_REENTER, /* In this state, we can restore more state. */
        STATE_PARSE_FRAMESET,         /* In this state, we will parse frameset content. */
        STATE_PARSE_FRAMESET_REENTER, /* We need to cleanup some things after parsing frameset. */
    } state = STATE_INITIAL;

    TY_(SetOptionBool)( doc, TidyXmlTags, no );

    if ( html == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node;
        DEBUG_LOG_REENTER_WITH_NODE(node);
        html = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.reentry_mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(html);
    }

    /*
     This main loop pulls tokens from the lexer until we're out of tokens,
     or until there's no more work to do.
     */
    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL || state == STATE_PRE_BODY )
        {
            node = TY_(GetToken)( doc, IgnoreWhitespace );
            DEBUG_LOG_GOT_TOKEN(node);
        }

        switch ( state )
        {
            /**************************************************************
             This case is all about finding a head tag and dealing with
             cases were we don't, so that we can move on to parsing a head
             tag.
             **************************************************************/
            case STATE_INITIAL:
            {
                /*
                 The only way we can possibly be here is if the lexer
                 had nothing to give us. Thus we'll create our own
                 head, and set the signal to start parsing it.
                 */
                if (node == NULL)
                {
                    node = TY_(InferredTag)(doc, TidyTag_HEAD);
                    state = STATE_PARSE_HEAD;
                    continue;
                }

                /* We found exactly what we expected: head. */
                if ( nodeIsHEAD(node) )
                {
                    state = STATE_PARSE_HEAD;
                    continue;
                }

                /* We did not expect to find an html closing tag here! */
                if (html && (node->tag == html->tag) && (node->type == EndTag))
                {
                    TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* Find and discard multiple <html> elements. */
                if (html && (node->tag == html->tag) && (node->type == StartTag))
                {
                    TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)(doc, node);
                    continue;
                }

                /* Deal with comments, etc. */
                if (InsertMisc(html, node))
                    continue;

                /*
                 At this point, we didn't find a head tag, so put the
                 token back and create our own head tag, so we can
                 move on.
                 */
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_HEAD);
                state = STATE_PARSE_HEAD;
                continue;
            } break;


            /**************************************************************
             This case determines whether we're dealing with body or
             frameset + noframes, and sets things up accordingly.
             **************************************************************/
            case STATE_PRE_BODY:
            {
                if (node == NULL )
                {
                    if (frameset == NULL) /* Implied body. */
                    {
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        state = STATE_PARSE_BODY;
                    } else {
                        state = STATE_COMPLETE;
                    }

                    continue;
                }

                /* Robustly handle html tags. */
                if (node->tag == html->tag)
                {
                    if (node->type != StartTag && frameset == NULL)
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);

                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* Deal with comments, etc. */
                if (InsertMisc(html, node))
                    continue;

                /* If frameset document, coerce <body> to <noframes> */
                if ( nodeIsBODY(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
                    {
                        if (frameset != NULL)
                        {
                            TY_(UngetToken)( doc );

                            if (noframes == NULL)
                            {
                                noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                                TY_(InsertNodeAtEnd)(frameset, noframes);
                                TY_(Report)(doc, html, noframes, INSERTING_TAG);
                            }
                            else
                            {
                                if (noframes->type == StartEndTag)
                                    noframes->type = StartTag;
                            }

                            state = STATE_PARSE_NOFRAMES;
                            continue;
                        }
                    }

                    TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
                    state = STATE_PARSE_BODY;
                    continue;
                }

                /* Flag an error if we see more than one frameset. */
                if ( nodeIsFRAMESET(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if (frameset != NULL)
                        TY_(Report)(doc, html, node, DUPLICATE_FRAMESET);
                    else
                        frameset = node;

                    state = STATE_PARSE_FRAMESET;
                    continue;
                }

                /* If not a frameset document coerce <noframes> to <body>. */
                if ( nodeIsNOFRAMES(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if (frameset == NULL)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        state = STATE_PARSE_BODY;
                        continue;
                    }

                    if (noframes == NULL)
                    {
                        noframes = node;
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                        state = STATE_PARSE_NOFRAMES;
                    }
                    else
                    {
                        TY_(FreeNode)( doc, node);
                    }

                    continue;
                }

                /* Deal with some other element that we're not expecting. */
                if (TY_(nodeIsElement)(node))
                {
                    if (node->tag && node->tag->model & CM_HEAD)
                    {
                        MoveToHead(doc, html, node);
                        continue;
                    }

                    /* Discard illegal frame element following a frameset. */
                    if ( frameset != NULL && nodeIsFRAME(node) )
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)(doc, node);
                        continue;
                    }
                }

                TY_(UngetToken)( doc );

                /* Insert other content into noframes element. */
                if (frameset)
                {
                    if (noframes == NULL)
                    {
                        noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                    }
                    else
                    {
                        TY_(Report)(doc, html, node, NOFRAMES_CONTENT);
                        if (noframes->type == StartEndTag)
                            noframes->type = StartTag;
                    }

                    TY_(ConstrainVersion)(doc, VERS_FRAMESET);
                    state = STATE_PARSE_NOFRAMES;
                    continue;
                }

                node = TY_(InferredTag)(doc, TidyTag_BODY);

                /* Issue #132 - disable inserting BODY tag warning
                 BUT only if NOT --show-body-only yes */
                if (!showingBodyOnly(doc))
                    TY_(Report)(doc, html, node, INSERTING_TAG );

                TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
                state = STATE_PARSE_BODY;
                continue;
            } break;


            /**************************************************************
             In this case, we're ready to parse the head, and move on to
             look for the body or body alternative.
             **************************************************************/
            case STATE_PARSE_HEAD:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = node;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_HEAD_REENTER;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;

            case STATE_PARSE_HEAD_REENTER:
            {
                head = node;
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             In this case, we can finally parse a body.
             **************************************************************/
            case STATE_PARSE_BODY:
            {
                TidyParserMemory memory = {0};
                memory.identity = NULL; /* we don't need to reenter */
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = NULL;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_COMPLETE;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;


            /**************************************************************
             In this case, we will parse noframes. If necessary, the
             node is already inserted in the proper spot.
             **************************************************************/
            case STATE_PARSE_NOFRAMES:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = frameset;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_NOFRAMES_REENTER;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return noframes;
            } break;

            case STATE_PARSE_NOFRAMES_REENTER:
            {
                frameset = node;
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             In this case, we parse the frameset, and look for noframes
             content to merge later if necessary.
             **************************************************************/
            case STATE_PARSE_FRAMESET:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = frameset;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_FRAMESET_REENTER;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;

            case (STATE_PARSE_FRAMESET_REENTER):
            {
                frameset = node;
                /*
                 See if it includes a noframes element so that
                 we can merge subsequent noframes elements.
                 */
                for (node = frameset->content; node; node = node->next)
                {
                    if ( nodeIsNOFRAMES(node) )
                        noframes = node;
                }
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             We really shouldn't get here, but if we do, finish nicely.
             **************************************************************/
            default:
            {
                state = STATE_COMPLETE;
            }
        } /* switch */
    } /* while */

    DEBUG_LOG_EXIT;
    return NULL;
}